

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_adaptor_encrypt
              (secp256k1_context *ctx,uchar *adaptor_sig162,uchar *seckey32,secp256k1_pubkey *enckey
              ,uchar *msg32,secp256k1_nonce_function_hardened_ecdsa_adaptor noncefp,void *ndata)

{
  int iVar1;
  uint uVar2;
  long in_RCX;
  long in_RDX;
  void *in_RSI;
  secp256k1_context *in_RDI;
  long in_R8;
  secp256k1_scalar *in_R9;
  secp256k1_scalar *in_stack_00000008;
  int ret;
  size_t size;
  uchar buf33 [33];
  uchar nonce32 [32];
  secp256k1_scalar n;
  secp256k1_scalar sigr;
  secp256k1_scalar sp;
  secp256k1_scalar msg;
  secp256k1_scalar sk;
  secp256k1_scalar dleq_proof_e;
  secp256k1_scalar dleq_proof_s;
  secp256k1_ge enckey_ge;
  secp256k1_ge rp;
  secp256k1_ge r;
  secp256k1_gej rpj;
  secp256k1_gej rj;
  secp256k1_scalar k;
  size_t *in_stack_fffffffffffffc38;
  secp256k1_fe *bin;
  secp256k1_callback *in_stack_fffffffffffffc40;
  secp256k1_scalar *r_00;
  secp256k1_ge *in_stack_fffffffffffffc48;
  secp256k1_scalar *in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc58;
  uint uVar3;
  secp256k1_ge *r_01;
  secp256k1_scalar *in_stack_fffffffffffffc68;
  secp256k1_scalar *in_stack_fffffffffffffc70;
  secp256k1_pubkey *in_stack_fffffffffffffc78;
  secp256k1_ge *in_stack_fffffffffffffc80;
  secp256k1_context *in_stack_fffffffffffffc88;
  secp256k1_ge *in_stack_fffffffffffffc90;
  undefined1 local_368 [40];
  secp256k1_scalar local_340;
  secp256k1_scalar local_320;
  secp256k1_scalar *in_stack_fffffffffffffd00;
  secp256k1_gej *in_stack_fffffffffffffd08;
  secp256k1_ecmult_gen_context *in_stack_fffffffffffffd10;
  secp256k1_scalar local_2c0;
  secp256k1_scalar local_2a0;
  secp256k1_scalar local_280 [2];
  secp256k1_ge *in_stack_fffffffffffffdd0;
  secp256k1_ge *in_stack_fffffffffffffdd8;
  secp256k1_scalar *in_stack_fffffffffffffde0;
  secp256k1_scalar *in_stack_fffffffffffffde8;
  secp256k1_scalar *in_stack_fffffffffffffdf0;
  secp256k1_context *in_stack_fffffffffffffdf8;
  secp256k1_scalar *in_stack_fffffffffffffe08;
  secp256k1_ge *in_stack_fffffffffffffe10;
  secp256k1_nonce_function_hardened_ecdsa_adaptor in_stack_fffffffffffffe18;
  void *in_stack_fffffffffffffe20;
  secp256k1_fe local_1b0 [8];
  secp256k1_scalar local_58;
  secp256k1_scalar *local_38;
  long local_30;
  long local_28;
  long local_20;
  void *local_18;
  secp256k1_context *local_10;
  uint local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_368,0,0x20);
  r_01 = (secp256k1_ge *)0x21;
  uVar3 = 1;
  iVar1 = secp256k1_ecmult_gen_context_is_built(&local_10->ecmult_gen_ctx);
  if (iVar1 == 0) {
    secp256k1_callback_call(in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
    local_4 = 0;
  }
  else if (local_18 == (void *)0x0) {
    secp256k1_callback_call(in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
    local_4 = 0;
  }
  else if (local_20 == 0) {
    secp256k1_callback_call(in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
    local_4 = 0;
  }
  else if (local_28 == 0) {
    secp256k1_callback_call(in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
    local_4 = 0;
  }
  else if (local_30 == 0) {
    secp256k1_callback_call(in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
    local_4 = 0;
  }
  else {
    secp256k1_scalar_clear(&local_2a0);
    secp256k1_scalar_clear(local_280);
    if (local_38 == (secp256k1_scalar *)0x0) {
      local_38 = (secp256k1_scalar *)nonce_function_ecdsa_adaptor;
    }
    uVar2 = secp256k1_pubkey_load
                      (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78
                      );
    uVar2 = uVar2 & uVar3;
    uVar3 = secp256k1_eckey_pubkey_serialize
                      (in_stack_fffffffffffffc48,(uchar *)in_stack_fffffffffffffc40,
                       in_stack_fffffffffffffc38,0);
    uVar3 = uVar3 & uVar2;
    iVar1 = (*(code *)local_38)(local_368,local_30,local_20,&stack0xfffffffffffffc68,
                                "ECDSAadaptor/non",0x10,in_stack_00000008);
    uVar3 = iVar1 != 0 & uVar3;
    secp256k1_scalar_set_b32
              (in_stack_fffffffffffffc50,(uchar *)in_stack_fffffffffffffc48,
               (int *)in_stack_fffffffffffffc40);
    iVar1 = secp256k1_scalar_is_zero(&local_58);
    uVar3 = ((iVar1 != 0 ^ 0xffU) & 1) & uVar3;
    secp256k1_scalar_cmov(&local_58,&secp256k1_scalar_one,(uint)((uVar3 != 0 ^ 0xffU) & 1));
    secp256k1_ecmult_gen
              (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    secp256k1_ge_set_gej(in_stack_fffffffffffffc90,(secp256k1_gej *)in_stack_fffffffffffffc88);
    secp256k1_ecmult_const
              ((secp256k1_gej *)rpj.z.n[0],(secp256k1_ge *)rpj.y.n[4],(secp256k1_scalar *)rpj.y.n[3]
               ,rpj.y.n[2]._4_4_);
    secp256k1_ge_set_gej(in_stack_fffffffffffffc90,(secp256k1_gej *)in_stack_fffffffffffffc88);
    secp256k1_declassify(local_10,&stack0xfffffffffffffdf8,0x58);
    secp256k1_declassify(local_10,local_1b0,0x58);
    bin = local_1b0;
    r_00 = local_38;
    uVar2 = secp256k1_dleq_prove
                      (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8
                       ,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                       in_stack_fffffffffffffdd0,in_stack_fffffffffffffe10,in_stack_fffffffffffffe18
                       ,in_stack_fffffffffffffe20);
    uVar2 = uVar2 & uVar3;
    uVar3 = secp256k1_scalar_set_b32_seckey(r_00,(uchar *)bin);
    uVar3 = uVar3 & uVar2;
    secp256k1_scalar_cmov(&local_2c0,&secp256k1_scalar_one,(uint)((uVar3 != 0 ^ 0xffU) & 1));
    secp256k1_scalar_set_b32(in_stack_fffffffffffffc50,(uchar *)in_stack_00000008,(int *)r_00);
    secp256k1_fe_normalize(local_1b0);
    secp256k1_fe_get_b32(&stack0xfffffffffffffc68,local_1b0);
    secp256k1_scalar_set_b32(in_stack_fffffffffffffc50,(uchar *)in_stack_00000008,(int *)r_00);
    iVar1 = secp256k1_scalar_is_zero(&local_320);
    uVar3 = ((iVar1 != 0 ^ 0xffU) & 1) & uVar3;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)in_stack_fffffffffffffc80,
               (secp256k1_scalar *)in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    secp256k1_scalar_add
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,(secp256k1_scalar *)r_01);
    secp256k1_scalar_inverse
              ((secp256k1_scalar *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    secp256k1_scalar_mul
              ((secp256k1_scalar *)in_stack_fffffffffffffc80,
               (secp256k1_scalar *)in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)&stack0xfffffffffffffd00);
    uVar3 = ((iVar1 != 0 ^ 0xffU) & 1) & uVar3;
    uVar2 = secp256k1_ecdsa_adaptor_sig_serialize
                      ((uchar *)in_stack_fffffffffffffc68,r_01,
                       (secp256k1_ge *)CONCAT44(uVar3,in_stack_fffffffffffffc58),
                       in_stack_fffffffffffffc50,in_stack_00000008,r_00);
    uVar2 = uVar2 & uVar3;
    secp256k1_memczero(local_18,0xa2,(uint)((uVar2 != 0 ^ 0xffU) & 1));
    secp256k1_scalar_clear(&local_340);
    secp256k1_scalar_clear(&local_58);
    secp256k1_scalar_clear(&local_2c0);
    local_4 = uVar2;
  }
  return local_4;
}

Assistant:

int secp256k1_ecdsa_adaptor_encrypt(const secp256k1_context* ctx, unsigned char *adaptor_sig162, unsigned char *seckey32, const secp256k1_pubkey *enckey, const unsigned char *msg32, secp256k1_nonce_function_hardened_ecdsa_adaptor noncefp, void *ndata) {
    secp256k1_scalar k;
    secp256k1_gej rj, rpj;
    secp256k1_ge r, rp;
    secp256k1_ge enckey_ge;
    secp256k1_scalar dleq_proof_s;
    secp256k1_scalar dleq_proof_e;
    secp256k1_scalar sk;
    secp256k1_scalar msg;
    secp256k1_scalar sp;
    secp256k1_scalar sigr;
    secp256k1_scalar n;
    unsigned char nonce32[32] = { 0 };
    unsigned char buf33[33];
    size_t size = 33;
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(adaptor_sig162 != NULL);
    ARG_CHECK(seckey32 != NULL);
    ARG_CHECK(enckey != NULL);
    ARG_CHECK(msg32 != NULL);

    secp256k1_scalar_clear(&dleq_proof_e);
    secp256k1_scalar_clear(&dleq_proof_s);

    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_ecdsa_adaptor;
    }

    ret &= secp256k1_pubkey_load(ctx, &enckey_ge, enckey);
    ret &= secp256k1_eckey_pubkey_serialize(&enckey_ge, buf33, &size, 1);
    ret &= !!noncefp(nonce32, msg32, seckey32, buf33, ecdsa_adaptor_algo, sizeof(ecdsa_adaptor_algo), ndata);
    secp256k1_scalar_set_b32(&k, nonce32, NULL);
    ret &= !secp256k1_scalar_is_zero(&k);
    secp256k1_scalar_cmov(&k, &secp256k1_scalar_one, !ret);

    /* R' := k*G */
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &rpj, &k);
    secp256k1_ge_set_gej(&rp, &rpj);
    /* R = k*Y; */
    secp256k1_ecmult_const(&rj, &enckey_ge, &k, 256);
    secp256k1_ge_set_gej(&r, &rj);
    /* We declassify the non-secret values rp and r to allow using them
     * as branch points. */
    secp256k1_declassify(ctx, &rp, sizeof(rp));
    secp256k1_declassify(ctx, &r, sizeof(r));

    /* dleq_proof = DLEQ_prove(k, (R', Y, R)) */
    ret &= secp256k1_dleq_prove(ctx, &dleq_proof_s, &dleq_proof_e, &k, &enckey_ge, &rp, &r, noncefp, ndata);

    ret &= secp256k1_scalar_set_b32_seckey(&sk, seckey32);
    secp256k1_scalar_cmov(&sk, &secp256k1_scalar_one, !ret);
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    secp256k1_fe_normalize(&r.x);
    secp256k1_fe_get_b32(buf33, &r.x);
    secp256k1_scalar_set_b32(&sigr, buf33, NULL);
    ret &= !secp256k1_scalar_is_zero(&sigr);
    /* s' = k⁻¹(m + R.x * x) */
    secp256k1_scalar_mul(&n, &sigr, &sk);
    secp256k1_scalar_add(&n, &n, &msg);
    secp256k1_scalar_inverse(&sp, &k);
    secp256k1_scalar_mul(&sp, &sp, &n);
    ret &= !secp256k1_scalar_is_zero(&sp);

    /* return (R, R', s', dleq_proof) */
    ret &= secp256k1_ecdsa_adaptor_sig_serialize(adaptor_sig162, &r, &rp, &sp, &dleq_proof_e, &dleq_proof_s);

    secp256k1_memczero(adaptor_sig162, 162, !ret);
    secp256k1_scalar_clear(&n);
    secp256k1_scalar_clear(&k);
    secp256k1_scalar_clear(&sk);

    return ret;
}